

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_pair.hpp
# Opt level: O2

void __thiscall
boost::details::compressed_pair_imp<$c173bb38$>::compressed_pair_imp
          (compressed_pair_imp<_c173bb38_> *this,first_param_type x,second_param_type y)

{
  compressed_pair_imp<$2f499042$>::compressed_pair_imp
            ((compressed_pair_imp<_2f499042_> *)this,(compressed_pair_imp<_2f499042_> *)x);
  spirit::classic::
  action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DebugOutput>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessORow>
  ::action(&this->second_,y);
  return;
}

Assistant:

compressed_pair_imp(first_param_type x, second_param_type y)
         : first_(x), second_(y) {}